

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

int get_grouplength(uint32_t **pptrptr,BOOL isinline,int *errcodeptr,int *lcptr,int group,
                   parsed_recurse_check *recurses,compile_block_16 *cb)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint uVar4;
  
  if ((0 < group) && ((cb->external_flags & 0x200000) == 0)) {
    uVar4 = cb->groupinfo[(uint)group];
    if ((uVar4 >> 0x1e & 1) != 0) {
      return -1;
    }
    if ((int)uVar4 < 0) {
      if (isinline != 0) {
        puVar3 = parsed_skip(*pptrptr,2);
        *pptrptr = puVar3;
      }
      return uVar4 & 0xffff;
    }
  }
  uVar4 = 0xffffffff;
  while ((uVar2 = get_branchlength(pptrptr,errcodeptr,lcptr,recurses,cb), -1 < (int)uVar2 &&
         ((uVar1 = uVar2, uVar4 == 0xffffffff || (uVar1 = uVar4, uVar4 == uVar2))))) {
    uVar4 = uVar1;
    if (**pptrptr == 0x80190000) {
      if (group < 1) {
        return uVar4;
      }
      cb->groupinfo[(uint)group] = cb->groupinfo[(uint)group] | uVar4 | 0x80000000;
      return uVar4;
    }
    *pptrptr = *pptrptr + 1;
  }
  if (0 < group) {
    cb->groupinfo[(uint)group] = cb->groupinfo[(uint)group] | 0x40000000;
  }
  return -1;
}

Assistant:

static int
get_grouplength(uint32_t **pptrptr, BOOL isinline, int *errcodeptr, int *lcptr,
  int group, parsed_recurse_check *recurses, compile_block *cb)
{
int branchlength;
int grouplength = -1;

/* The cache can be used only if there is no possibility of there being two
groups with the same number. We do not need to set the end pointer for a group
that is being processed as a back reference or recursion, but we must do so for
an inline group. */

if (group > 0 && (cb->external_flags & PCRE2_DUPCAPUSED) == 0)
  {
  uint32_t groupinfo = cb->groupinfo[group];
  if ((groupinfo & GI_NOT_FIXED_LENGTH) != 0) return -1;
  if ((groupinfo & GI_SET_FIXED_LENGTH) != 0)
    {
    if (isinline) *pptrptr = parsed_skip(*pptrptr, PSKIP_KET);
    return groupinfo & GI_FIXED_LENGTH_MASK;
    }
  }

/* Scan the group. In this case we find the end pointer of necessity. */

for(;;)
  {
  branchlength = get_branchlength(pptrptr, errcodeptr, lcptr, recurses, cb);
  if (branchlength < 0) goto ISNOTFIXED;
  if (grouplength == -1) grouplength = branchlength;
    else if (grouplength != branchlength) goto ISNOTFIXED;
  if (**pptrptr == META_KET) break;
  *pptrptr += 1;   /* Skip META_ALT */
  }

if (group > 0)
  cb->groupinfo[group] |= (uint32_t)(GI_SET_FIXED_LENGTH | grouplength);
return grouplength;

ISNOTFIXED:
if (group > 0) cb->groupinfo[group] |= GI_NOT_FIXED_LENGTH;
return -1;
}